

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

double getAveLen(Mesh *mesh,VectorXd *x)

{
  bool bVar1;
  reference pvVar2;
  CoeffReturnType pdVar3;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDI;
  double v;
  double dVar4;
  Vec2d ev;
  int end;
  int st;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __end1;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1;
  ConstEdgeRange *__range1;
  double len;
  int count;
  PolyConnectivity *in_stack_ffffffffffffff48;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_stack_ffffffffffffff50;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this;
  BaseHandle _heh;
  double in_stack_ffffffffffffff60;
  VectorT<double,2> local_88 [20];
  int local_74;
  BaseHandle local_70;
  BaseHandle local_6c;
  int local_68;
  int local_64;
  BaseHandle local_60;
  BaseHandle local_5c;
  int local_58;
  int local_54;
  undefined1 local_50 [16];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  local_40 [16];
  PolyConnectivity *local_30;
  PolyConnectivity **local_28;
  double local_20;
  int local_14;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_8;
  
  local_14 = 0;
  local_20 = 0.0;
  local_8 = in_RDI;
  local_30 = (PolyConnectivity *)OpenMesh::PolyConnectivity::all_edges(in_stack_ffffffffffffff48);
  local_28 = &local_30;
  local_40 = (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
               [16])OpenMesh::PolyConnectivity::
                    EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                    ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                             *)in_stack_ffffffffffffff50);
  local_50 = OpenMesh::PolyConnectivity::
             EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
             ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                    *)in_stack_ffffffffffffff50);
  while( true ) {
    _heh.idx_ = SUB84(in_stack_ffffffffffffff60,0);
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                          *)in_stack_ffffffffffffff50,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                          *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    pvVar2 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
             ::operator*(local_40);
    local_64 = (pvVar2->super_BaseHandle).idx_;
    local_14 = local_14 + 1;
    in_stack_ffffffffffffff50 = local_8;
    local_54 = local_64;
    local_60.idx_ =
         (int)OpenMesh::ArrayKernel::halfedge_handle
                        (&in_stack_ffffffffffffff48->super_ArrayKernel,(BaseHandle)(int)local_8,0);
    local_5c.idx_ =
         (int)OpenMesh::ArrayKernel::to_vertex_handle
                        (&in_stack_ffffffffffffff48->super_ArrayKernel,
                         (BaseHandle)(int)in_stack_ffffffffffffff50);
    local_58 = OpenMesh::BaseHandle::idx(&local_5c);
    local_74 = local_54;
    this = local_8;
    local_70.idx_ =
         (int)OpenMesh::ArrayKernel::halfedge_handle
                        (&in_stack_ffffffffffffff48->super_ArrayKernel,
                         (BaseHandle)(int)in_stack_ffffffffffffff50,0);
    local_6c.idx_ = (int)OpenMesh::ArrayKernel::from_vertex_handle((ArrayKernel *)this,_heh.idx_);
    local_68 = OpenMesh::BaseHandle::idx(&local_6c);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff60 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    v = in_stack_ffffffffffffff60 - *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    dVar4 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_88,v,dVar4 - *pdVar3);
    dVar4 = OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1d112b);
    local_20 = dVar4 + local_20;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                  *)in_stack_ffffffffffffff50);
  }
  return local_20 / (double)local_14;
}

Assistant:

double getAveLen(const Mesh& mesh, const Eigen::VectorXd& x) {
    int count = 0;
    double len = 0.0;
    for (auto e: mesh.all_edges()) {
        ++count;
        int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        OpenMesh::Vec2d ev(x[2 * st] - x[2 *end], x[2 * st + 1] - x[2 * end + 1]);
        len += ev.norm();
    }

    return len / count; 
}